

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O2

void __thiscall libtorrent::anon_unknown_6::ut_pex_plugin::tick(ut_pex_plugin *this)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  pointer pppVar4;
  peer_connection *p;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  torrent_flags_t tVar9;
  time_point tVar10;
  entry *peVar11;
  string_type *psVar12;
  string_type *psVar13;
  undefined8 *puVar14;
  iterator __position;
  undefined4 extraout_var_00;
  _Base_ptr p_Var15;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar16;
  pointer pppVar17;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  int local_ec;
  endpoint remote;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  plf6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pld6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  plf_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pld_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla_out;
  entry pex;
  set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  dropped;
  undefined4 extraout_var;
  
  tVar9 = aux::torrent::flags(this->m_torrent);
  if (((uint)tVar9.m_val >> 0x15 & 1) == 0) {
    tVar10 = aux::time_now();
    if ((this->m_last_msg).__d.__r <= (long)tVar10.__d.__r + -60000000000) {
      (this->m_last_msg).__d.__r = (rep)tVar10.__d.__r;
      iVar8 = aux::torrent::num_peers(this->m_torrent);
      if (iVar8 != 0) {
        entry::entry(&pex);
        key._M_str = "added";
        key._M_len = 5;
        peVar11 = entry::operator[](&pex,key);
        psVar12 = entry::string_abi_cxx11_(peVar11);
        key_00._M_str = "dropped";
        key_00._M_len = 7;
        peVar11 = entry::operator[](&pex,key_00);
        psVar13 = entry::string_abi_cxx11_(peVar11);
        key_01._M_str = "added.f";
        key_01._M_len = 7;
        peVar11 = entry::operator[](&pex,key_01);
        plf_out.container = entry::string_abi_cxx11_(peVar11);
        key_02._M_str = "added6";
        key_02._M_len = 6;
        pld_out.container = psVar13;
        pla_out.container = psVar12;
        peVar11 = entry::operator[](&pex,key_02);
        psVar12 = entry::string_abi_cxx11_(peVar11);
        key_03._M_str = "dropped6";
        key_03._M_len = 8;
        peVar11 = entry::operator[](&pex,key_03);
        psVar13 = entry::string_abi_cxx11_(peVar11);
        key_04._M_str = "added6.f";
        key_04._M_len = 8;
        peVar11 = entry::operator[](&pex,key_04);
        plf6_out.container = entry::string_abi_cxx11_(peVar11);
        dropped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &dropped._M_t._M_impl.super__Rb_tree_header._M_header;
        dropped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        dropped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        dropped._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pld6_out.container = psVar13;
        pla6_out.container = psVar12;
        dropped._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             dropped._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ::std::
        _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::swap(&(this->m_old_peers)._M_t,&dropped._M_t);
        this->m_peers_in_message = 0;
        pppVar17 = (this->m_torrent->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pppVar4 = (this->m_torrent->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_ec = 0;
        for (; pppVar17 != pppVar4; pppVar17 = pppVar17 + 1) {
          p = *pppVar17;
          bVar6 = send_peer(p);
          if (bVar6) {
            iVar8 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(p);
            puVar14 = (undefined8 *)CONCAT44(extraout_var,iVar8);
            remote.impl_.data_._0_8_ = *puVar14;
            remote.impl_.data_._20_8_ = *(undefined8 *)((long)puVar14 + 0x14);
            remote.impl_.data_._16_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)puVar14 + 0xc) >> 0x20);
            remote.impl_.data_._8_4_ = (undefined4)puVar14[1];
            remote.impl_.data_._12_4_ = (undefined4)((ulong)puVar14[1] >> 0x20);
            ::std::
            _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::_M_insert_unique<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&>
                      ((_Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)&this->m_old_peers,&remote);
            __position = ::std::
                         _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                         ::find(&dropped._M_t,&remote);
            if ((_Rb_tree_header *)__position._M_node == &dropped._M_t._M_impl.super__Rb_tree_header
               ) {
              if (99 < local_ec) break;
              iVar8 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[4])(p);
              if ((char)iVar8 == '\0') {
                if ((p->field_0x885 & 8) == 0) {
                  iVar8 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[7])(p);
                  if ((CONCAT44(extraout_var_00,iVar8) != 0) &&
                     (uVar3 = *(ushort *)(CONCAT44(extraout_var_00,iVar8) + 0x18), uVar3 != 0)) {
                    remote.impl_.data_.v4.sin_port = uVar3 << 8 | uVar3 >> 8;
                  }
                }
                bVar6 = aux::peer_connection::is_seed(p);
                bVar1 = p->field_0x889;
                bVar7 = aux::is_utp(&p->m_socket);
                uVar2 = p[1].m_socket.
                        super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        .
                        super__Variant_base<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        .
                        super__Move_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        .
                        super__Copy_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        .
                        super__Move_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        .
                        super__Copy_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        .
                        super__Variant_storage_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        ._M_u._M_first._M_storage._M_storage[0x35];
                if (remote.impl_.data_.base.sa_family == 2) {
                  aux::
                  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                            (&remote,&pla_out);
                  pbVar16 = &plf_out;
                }
                else {
                  aux::
                  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                            (&remote,&pla6_out);
                  pbVar16 = &plf6_out;
                }
                aux::
                write_impl<unsigned_char,unsigned_char,std::back_insert_iterator<std::__cxx11::string>>
                          ((uVar2 != '\0') << 3 | bVar7 << 2 | bVar1 >> 6 & 1 | bVar6 * '\x02',
                           pbVar16);
                local_ec = local_ec + 1;
                this->m_peers_in_message = this->m_peers_in_message + 1;
              }
            }
            else {
              ::std::
              _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
              ::erase_abi_cxx11_((_Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                                  *)&dropped,(const_iterator)__position._M_node);
            }
          }
        }
        for (p_Var15 = dropped._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != &dropped._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
          pbVar16 = &pld6_out;
          if ((short)p_Var15[1]._M_color == 2) {
            pbVar16 = &pld_out;
          }
          aux::
          write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                    ((basic_endpoint<boost::asio::ip::tcp> *)(p_Var15 + 1),pbVar16);
          this->m_peers_in_message = this->m_peers_in_message + 1;
        }
        pcVar5 = (this->m_ut_pex_msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->m_ut_pex_msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish != pcVar5) {
          (this->m_ut_pex_msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar5;
        }
        bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                   &this->m_ut_pex_msg,&pex);
        ::std::
        _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::~_Rb_tree(&dropped._M_t);
        entry::~entry(&pex);
      }
    }
  }
  return;
}

Assistant:

void tick() override
		{
			if (m_torrent.flags() & torrent_flags::disable_pex) return;

			time_point const now = aux::time_now();
			if (now - seconds(60) < m_last_msg) return;
			m_last_msg = now;

			if (m_torrent.num_peers() == 0) return;

			entry pex;
			std::string& pla = pex["added"].string();
			std::string& pld = pex["dropped"].string();
			std::string& plf = pex["added.f"].string();
			std::back_insert_iterator<std::string> pla_out(pla);
			std::back_insert_iterator<std::string> pld_out(pld);
			std::back_insert_iterator<std::string> plf_out(plf);
			std::string& pla6 = pex["added6"].string();
			std::string& pld6 = pex["dropped6"].string();
			std::string& plf6 = pex["added6.f"].string();
			std::back_insert_iterator<std::string> pla6_out(pla6);
			std::back_insert_iterator<std::string> pld6_out(pld6);
			std::back_insert_iterator<std::string> plf6_out(plf6);

			std::set<tcp::endpoint> dropped;
			m_old_peers.swap(dropped);

			m_peers_in_message = 0;
			int num_added = 0;
			for (auto const* peer : m_torrent)
			{
				if (!send_peer(*peer)) continue;

				tcp::endpoint remote = peer->remote();
				m_old_peers.insert(remote);

				auto const di = dropped.find(remote);
				if (di == dropped.end())
				{
					// don't write too big of a package
					if (num_added >= max_peer_entries) break;

					// only send proper bittorrent peers
					if (peer->type() != connection_type::bittorrent)
						continue;

					auto const* const p = static_cast<aux::bt_peer_connection const*>(peer);

					// if the peer has told us which port its listening on,
					// use that port. But only if we didn't connect to the peer.
					// if we connected to it, use the port we know works
					if (!p->is_outgoing())
					{
						aux::torrent_peer const* const pi = peer->peer_info_struct();
						if (pi != nullptr && pi->port > 0)
							remote.port(pi->port);
					}

					// no supported flags to set yet
					// 0x01 - peer supports encryption
					// 0x02 - peer is a seed
					// 0x04 - supports uTP. This is only a positive flags
					//        passing 0 doesn't mean the peer doesn't
					//        support uTP
					// 0x08 - supports hole punching protocol. If this
					//        flag is received from a peer, it can be
					//        used as a rendezvous point in case direct
					//        connections to the peer fail
					pex_flags_t flags = p->is_seed() ? pex_seed : pex_flags_t{};
#if !defined TORRENT_DISABLE_ENCRYPTION
					flags |= p->supports_encryption() ? pex_encryption : pex_flags_t{};
#endif
					flags |= is_utp(p->get_socket()) ? pex_utp : pex_flags_t{};
					flags |= p->supports_holepunch() ? pex_holepunch : pex_flags_t{};

					// i->first was added since the last time
					if (aux::is_v4(remote))
					{
						aux::write_endpoint(remote, pla_out);
						aux::write_uint8(static_cast<std::uint8_t>(flags), plf_out);
					}
					else
					{
						aux::write_endpoint(remote, pla6_out);
						aux::write_uint8(static_cast<std::uint8_t>(flags), plf6_out);
					}
					++num_added;
					++m_peers_in_message;
				}
				else
				{
					// this was in the previous message
					// so, it wasn't dropped
					dropped.erase(di);
				}
			}

			for (auto const& i : dropped)
			{
				if (aux::is_v4(i))
					aux::write_endpoint(i, pld_out);
				else
					aux::write_endpoint(i, pld6_out);
				++m_peers_in_message;
			}

			m_ut_pex_msg.clear();
			bencode(std::back_inserter(m_ut_pex_msg), pex);
		}